

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

vec2 djb::ggx::md2_to_u2(vec2 *d,float_t zi)

{
  float fVar1;
  vec2 vVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float_t fVar6;
  float_t fVar7;
  
  fVar5 = 1.0 / (zi + 1.0);
  fVar3 = d->x;
  if (0.0 <= fVar3) {
    fVar3 = fVar3 / zi;
    fVar1 = d->y;
    for (fVar4 = atan2f(-fVar3,fVar1); fVar4 < 0.0; fVar4 = fVar4 + 6.2831855) {
    }
    fVar7 = fVar3 * fVar3 + fVar1 * fVar1;
    fVar6 = (1.0 - fVar5) * ((fVar4 + -3.1415927) / 3.1415927) + fVar5;
  }
  else {
    fVar1 = d->y;
    fVar7 = fVar3 * fVar3 + fVar1 * fVar1;
    fVar3 = atan2f(-fVar3,fVar1);
    fVar6 = fVar5 * (fVar3 / 3.1415927);
  }
  vVar2.y = fVar6;
  vVar2.x = fVar7;
  return vVar2;
}

Assistant:

vec2 ggx::md2_to_u2(const vec2& d, float_t zi)
{
	float_t a = 1 / (1 + zi);

#if 0
	if (d.x >= 0) {
		vec2 tmp = hd2_to_u2(vec2(d.x / zi, d.y));

		return vec2(tmp.x * (1 - a) + a, tmp.y);
	} else {
		vec2 tmp = hd2_to_u2(d);

		return vec2(a + a * tmp.x, tmp.y);
	}
#else

	if (d.x >= 0) {
		vec2 tmp = vec2(d.x / zi, d.y);
		float_t x = dot(tmp, tmp);
		float_t phi = atan2(-tmp.x, tmp.y);
		while (phi < 0) phi+= 2*m_pi();
		float_t tmp2 = (phi - m_pi()) / m_pi();
		float_t y = tmp2 * (1 - a) + a;

		return vec2(x, y);
	} else {
		float_t x = dot(d, d);
		float_t tmp = atan2(-d.x, d.y) / m_pi();
		float_t y = tmp * a;

		return vec2(x, y);
	}
#endif
}